

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS
ref_cavity_find_face_with_side
          (REF_CAVITY ref_cavity,REF_INT node0,REF_INT node1,REF_INT *found_face)

{
  int local_2c;
  REF_INT face;
  REF_INT *found_face_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_CAVITY ref_cavity_local;
  
  *found_face = -1;
  local_2c = 0;
  do {
    if (ref_cavity->maxface <= local_2c) {
      return 0;
    }
    if ((((-1 < local_2c) && (local_2c < ref_cavity->maxface)) &&
        (ref_cavity->f2n[local_2c * 3] != -1)) &&
       ((((node0 == ref_cavity->f2n[local_2c * 3] && (node1 == ref_cavity->f2n[local_2c * 3 + 1]))
         || ((node0 == ref_cavity->f2n[local_2c * 3 + 1] &&
             (node1 == ref_cavity->f2n[local_2c * 3 + 2])))) ||
        ((node0 == ref_cavity->f2n[local_2c * 3 + 2] && (node1 == ref_cavity->f2n[local_2c * 3])))))
       ) {
      if (*found_face != -1) {
        if (ref_cavity->debug != 0) {
          printf("at node0 %f %f %f\n",ref_cavity->ref_grid->node->real[node0 * 0xf],
                 ref_cavity->ref_grid->node->real[node0 * 0xf + 1],
                 ref_cavity->ref_grid->node->real[node0 * 0xf + 2]);
          printf("at node1 %f %f %f\n",ref_cavity->ref_grid->node->real[node1 * 0xf],
                 ref_cavity->ref_grid->node->real[node1 * 0xf + 1],
                 ref_cavity->ref_grid->node->real[node1 * 0xf + 2]);
        }
        ref_cavity->state = REF_CAVITY_INCONSISTENT;
        *found_face = -1;
        return 0;
      }
      *found_face = local_2c;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_find_face_with_side(REF_CAVITY ref_cavity,
                                                         REF_INT node0,
                                                         REF_INT node1,
                                                         REF_INT *found_face) {
  REF_INT face;

  *found_face = REF_EMPTY;

  each_ref_cavity_valid_face(ref_cavity, face) {
    if ((node0 == ref_cavity_f2n(ref_cavity, 0, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 1, face)) ||
        (node0 == ref_cavity_f2n(ref_cavity, 1, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (node0 == ref_cavity_f2n(ref_cavity, 2, face) &&
         node1 == ref_cavity_f2n(ref_cavity, 0, face))) {
      if (REF_EMPTY != *found_face) { /* found face twice */
        if (ref_cavity_debug(ref_cavity)) {
          printf("at node0 %f %f %f\n",
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                              node0),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                              node0),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                              node0));
          printf("at node1 %f %f %f\n",
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                              node1),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                              node1),
                 ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                              node1));
        }
        ref_cavity_state(ref_cavity) = REF_CAVITY_INCONSISTENT;
        *found_face = REF_EMPTY;
        return REF_SUCCESS;
      }
      *found_face = face;
    }
  }

  return REF_SUCCESS;
}